

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void cftmdl1(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double wn4r;
  int mh;
  int m;
  int k;
  int j3;
  int j2;
  int j1;
  int j0;
  int j;
  double *w_local;
  double *a_local;
  int n_local;
  
  iVar18 = n >> 3;
  iVar19 = iVar18 * 2;
  iVar20 = iVar18 * 4;
  iVar21 = iVar18 * 6;
  dVar1 = *a;
  dVar26 = a[iVar20];
  dVar27 = a[1];
  dVar2 = a[iVar20 + 1];
  dVar3 = *a;
  dVar24 = a[iVar20];
  dVar25 = a[1];
  dVar4 = a[iVar20 + 1];
  dVar5 = a[iVar19];
  dVar6 = a[iVar21];
  dVar7 = a[iVar19 + 1];
  dVar8 = a[iVar21 + 1];
  dVar9 = a[iVar19];
  dVar10 = a[iVar21];
  dVar11 = a[iVar19 + 1];
  dVar12 = a[iVar21 + 1];
  *a = dVar1 + dVar26 + dVar5 + dVar6;
  a[1] = dVar27 + dVar2 + dVar7 + dVar8;
  a[iVar19] = (dVar1 + dVar26) - (dVar5 + dVar6);
  a[iVar19 + 1] = (dVar27 + dVar2) - (dVar7 + dVar8);
  a[iVar20] = (dVar3 - dVar24) - (dVar11 - dVar12);
  a[iVar20 + 1] = (dVar25 - dVar4) + (dVar9 - dVar10);
  a[iVar21] = (dVar3 - dVar24) + (dVar11 - dVar12);
  a[iVar21 + 1] = (dVar25 - dVar4) - (dVar9 - dVar10);
  dVar1 = w[1];
  mh = 0;
  for (j1 = 2; j1 < iVar18; j1 = j1 + 2) {
    dVar26 = w[mh + 4];
    dVar27 = w[mh + 5];
    dVar2 = w[mh + 6];
    dVar3 = w[mh + 7];
    iVar20 = j1 + iVar19;
    iVar21 = iVar20 + iVar19;
    iVar22 = iVar21 + iVar19;
    dVar24 = a[j1];
    dVar25 = a[iVar21];
    dVar4 = a[j1 + 1];
    dVar5 = a[iVar21 + 1];
    dVar6 = a[j1];
    dVar7 = a[iVar21];
    dVar8 = a[j1 + 1];
    dVar9 = a[iVar21 + 1];
    dVar10 = a[iVar20];
    dVar11 = a[iVar22];
    dVar12 = a[iVar20 + 1];
    dVar13 = a[iVar22 + 1];
    dVar14 = a[iVar20];
    dVar15 = a[iVar22];
    dVar16 = a[iVar20 + 1];
    dVar17 = a[iVar22 + 1];
    a[j1] = dVar24 + dVar25 + dVar10 + dVar11;
    a[j1 + 1] = dVar4 + dVar5 + dVar12 + dVar13;
    a[iVar20] = (dVar24 + dVar25) - (dVar10 + dVar11);
    a[iVar20 + 1] = (dVar4 + dVar5) - (dVar12 + dVar13);
    dVar24 = (dVar6 - dVar7) - (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) + (dVar14 - dVar15);
    a[iVar21] = dVar26 * dVar24 + -(dVar27 * dVar25);
    a[iVar21 + 1] = dVar26 * dVar25 + dVar27 * dVar24;
    dVar24 = (dVar6 - dVar7) + (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) - (dVar14 - dVar15);
    a[iVar22] = dVar2 * dVar24 + dVar3 * dVar25;
    a[iVar22 + 1] = dVar2 * dVar25 + -(dVar3 * dVar24);
    iVar20 = iVar19 - j1;
    iVar21 = iVar20 + iVar19;
    iVar22 = iVar21 + iVar19;
    iVar23 = iVar22 + iVar19;
    dVar24 = a[iVar20];
    dVar25 = a[iVar22];
    dVar4 = a[iVar20 + 1];
    dVar5 = a[iVar22 + 1];
    dVar6 = a[iVar20];
    dVar7 = a[iVar22];
    dVar8 = a[iVar20 + 1];
    dVar9 = a[iVar22 + 1];
    dVar10 = a[iVar21];
    dVar11 = a[iVar23];
    dVar12 = a[iVar21 + 1];
    dVar13 = a[iVar23 + 1];
    dVar14 = a[iVar21];
    dVar15 = a[iVar23];
    dVar16 = a[iVar21 + 1];
    dVar17 = a[iVar23 + 1];
    a[iVar20] = dVar24 + dVar25 + dVar10 + dVar11;
    a[iVar20 + 1] = dVar4 + dVar5 + dVar12 + dVar13;
    a[iVar21] = (dVar24 + dVar25) - (dVar10 + dVar11);
    a[iVar21 + 1] = (dVar4 + dVar5) - (dVar12 + dVar13);
    dVar24 = (dVar6 - dVar7) - (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) + (dVar14 - dVar15);
    a[iVar22] = dVar27 * dVar24 + -(dVar26 * dVar25);
    a[iVar22 + 1] = dVar27 * dVar25 + dVar26 * dVar24;
    dVar26 = (dVar6 - dVar7) + (dVar16 - dVar17);
    dVar27 = (dVar8 - dVar9) - (dVar14 - dVar15);
    a[iVar23] = dVar3 * dVar26 + dVar2 * dVar27;
    a[iVar23 + 1] = dVar3 * dVar27 + -(dVar2 * dVar26);
    mh = mh + 4;
  }
  iVar20 = iVar18 * 3;
  iVar21 = iVar18 * 5;
  iVar19 = iVar18 * 7;
  dVar26 = a[iVar18];
  dVar27 = a[iVar21];
  dVar2 = a[iVar18 + 1];
  dVar3 = a[iVar21 + 1];
  dVar24 = a[iVar18];
  dVar25 = a[iVar21];
  dVar4 = a[iVar18 + 1];
  dVar5 = a[iVar21 + 1];
  dVar6 = a[iVar20];
  dVar7 = a[iVar19];
  dVar8 = a[iVar20 + 1];
  dVar9 = a[iVar19 + 1];
  dVar10 = a[iVar20];
  dVar11 = a[iVar19];
  dVar12 = a[iVar20 + 1];
  dVar13 = a[iVar19 + 1];
  a[iVar18] = dVar26 + dVar27 + dVar6 + dVar7;
  a[iVar18 + 1] = dVar2 + dVar3 + dVar8 + dVar9;
  a[iVar20] = (dVar26 + dVar27) - (dVar6 + dVar7);
  a[iVar20 + 1] = (dVar2 + dVar3) - (dVar8 + dVar9);
  dVar26 = (dVar24 - dVar25) - (dVar12 - dVar13);
  dVar27 = (dVar4 - dVar5) + (dVar10 - dVar11);
  a[iVar21] = dVar1 * (dVar26 - dVar27);
  a[iVar21 + 1] = dVar1 * (dVar27 + dVar26);
  dVar26 = (dVar24 - dVar25) + (dVar12 - dVar13);
  dVar27 = (dVar4 - dVar5) - (dVar10 - dVar11);
  a[iVar19] = -dVar1 * (dVar26 + dVar27);
  a[iVar19 + 1] = -dVar1 * (dVar27 - dVar26);
  return;
}

Assistant:

void cftmdl1(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  k = 0;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
  }
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
}